

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O3

void println(void)

{
  char cVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  int iVar10;
  char cVar11;
  
  if ((((list_level == 0) || (xlist == 0)) || (asm_opt[0] == 0)) ||
     ((expand_macro != 0 && (asm_opt[1] == 0)))) {
    return;
  }
  if (continued_line != 0) {
    strcpy(prlnbuf,tmplnbuf);
  }
  if (data_loccnt != -1) {
    loadlc(data_loccnt,0);
    iVar5 = loccnt - data_loccnt;
    if (data_level <= list_level || iVar5 < 4) {
      if (iVar5 < 1) {
        return;
      }
      iVar10 = 0;
      do {
        iVar3 = data_size;
        iVar2 = bank;
        lVar4 = (long)bank;
        uVar6 = 0x10;
        uVar8 = 0;
        while( true ) {
          if (iVar2 < 0xf0) {
            uVar7 = (uint)rom[lVar4][data_loccnt];
            lVar9 = 2;
            do {
              cVar1 = (char)(uVar7 & 0xf);
              cVar11 = cVar1 + '0';
              if (9 < (uVar7 & 0xf)) {
                cVar11 = cVar1 + '7';
              }
              (&DAT_00329ebf)[lVar9 + uVar6] = cVar11;
              uVar7 = uVar7 >> 4;
              lVar9 = lVar9 + -1;
            } while (lVar9 != 0);
          }
          else {
            (prlnbuf + uVar8 * 3 + 0x10)[0] = '-';
            (prlnbuf + uVar8 * 3 + 0x10)[1] = '-';
          }
          data_loccnt = data_loccnt + 1;
          uVar7 = (int)uVar8 + 1;
          uVar8 = (ulong)uVar7;
          if (uVar7 == iVar3) break;
          iVar10 = iVar10 + 1;
          uVar6 = (ulong)((int)uVar6 + 3);
          if (iVar10 == iVar5) goto LAB_0010fbf6;
        }
        fprintf((FILE *)lst_fp,"%s\n",prlnbuf);
        builtin_strncpy(prlnbuf,"                          ",0x1a);
        prlnbuf[0x1b] = '\0';
        loadlc(data_loccnt,0);
        iVar10 = iVar10 + 1;
        if (iVar10 == iVar5) {
          return;
        }
      } while( true );
    }
  }
LAB_0010fbf6:
  fprintf((FILE *)lst_fp,"%s\n",prlnbuf);
  return;
}

Assistant:

void
println(void)
{
	int nb, cnt;
	int i;

	/* check if output possible */
	if (list_level == 0)
		return;
	if (!xlist || !asm_opt[OPT_LIST] || (expand_macro && !asm_opt[OPT_MACRO]))
		return;

	/* update line buffer if necessary */
	if (continued_line)
		strcpy(prlnbuf, tmplnbuf);

	/* output */
	if (data_loccnt == -1)
		/* line buffer */
		fprintf(lst_fp, "%s\n", prlnbuf);
	else {
		/* line buffer + data bytes */
		loadlc(data_loccnt, 0);

		/* number of bytes */
		nb = loccnt - data_loccnt;

		/* check level */
		if ((data_level > list_level) && (nb > 3))
			/* doesn't match */
			fprintf(lst_fp, "%s\n", prlnbuf);
		else {
			/* ok */
			cnt = 0;
			for (i = 0; i < nb; i++) {
				if (bank >= RESERVED_BANK) {
					prlnbuf[16 + (3*cnt)] = '-';
					prlnbuf[17 + (3*cnt)] = '-';
				}
				else {
					hexcon(2, rom[bank][data_loccnt], &prlnbuf[16 + (3*cnt)]);
				}
				data_loccnt++;
				cnt++;
				if (cnt == data_size) {
					cnt = 0;
					fprintf(lst_fp, "%s\n", prlnbuf);
					clearln();
					loadlc(data_loccnt, 0);
				}
			}
			if (cnt)
				fprintf(lst_fp, "%s\n", prlnbuf);
		}
	}
}